

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

module_ * __thiscall
pybind11::module_::def<void(*)(kratos::Generator*,kratos::HashStrategy)>
          (module_ *this,char *name_,_func_void_Generator_ptr_HashStrategy **f)

{
  _func_void_Generator_ptr_HashStrategy *f_00;
  handle local_50;
  name local_48;
  scope local_40;
  object local_38;
  handle local_30;
  cpp_function func;
  
  f_00 = *f;
  local_40.value.m_ptr = (handle)(this->super_object).super_handle.m_ptr;
  local_38.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_48.value = name_;
  getattr((pybind11 *)&func,local_40.value,name_,(PyObject *)&_Py_NoneStruct);
  local_50.m_ptr = (PyObject *)func.super_function.super_object.super_handle.m_ptr;
  cpp_function::
  cpp_function<void,kratos::Generator*,kratos::HashStrategy,pybind11::name,pybind11::scope,pybind11::sibling>
            ((cpp_function *)&local_30,f_00,&local_48,&local_40,(sibling *)&local_50);
  object::~object((object *)&func);
  object::~object(&local_38);
  add_object(this,name_,local_30,true);
  object::~object((object *)&local_30);
  return this;
}

Assistant:

module_ &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }